

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::accumulateDerivatives
          (BeagleCPUImpl<double,_1,_1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  if (outDerivatives == (double *)0x0) {
    accumulateDerivativesDispatch1<false>
              (this,(double *)0x0,outSumDerivatives,outSumSquaredDerivatives);
    return;
  }
  accumulateDerivativesDispatch1<true>
            (this,outDerivatives,outSumDerivatives,outSumSquaredDerivatives);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivatives(double* outDerivatives,
                                                              double* outSumDerivatives,
                                                              double* outSumSquaredDerivatives) {
    if (outDerivatives == NULL) {
        accumulateDerivativesDispatch1<false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch1<true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}